

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall GameLoop::~GameLoop(GameLoop *this)

{
  vector<Player_*,_std::allocator<Player_*>_> *this_00;
  Deck *this_01;
  GameLoop *this_local;
  
  this_00 = this->allPlayers;
  if (this_00 != (vector<Player_*,_std::allocator<Player_*>_> *)0x0) {
    std::vector<Player_*,_std::allocator<Player_*>_>::~vector(this_00);
    operator_delete(this_00,0x18);
  }
  this->gameMap = (Map *)0x0;
  this_01 = this->gameDeck;
  if (this_01 != (Deck *)0x0) {
    Deck::~Deck(this_01);
    operator_delete(this_01,0x18);
  }
  return;
}

Assistant:

GameLoop::~GameLoop() {
    delete allPlayers;
    // In tournament mode, the maps are stored in a vector (heap memory) so we cant delete them if we reuse the map
    this->gameMap = nullptr;
    delete this->gameDeck;
}